

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

char * __thiscall
bloaty::CustomDataSource::_InternalParse(CustomDataSource *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  Regex *msg;
  uint uVar2;
  char *field_name;
  char cVar3;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
LAB_00185603:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
    if (bVar1) {
      return local_40;
    }
    local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
    uVar2 = local_34 >> 3;
    cVar3 = (char)local_34;
    if (uVar2 == 3) {
      if (cVar3 == '\x1a') {
        local_40 = local_40 + -1;
        do {
          local_40 = local_40 + 1;
          msg = google::protobuf::RepeatedPtrField<bloaty::Regex>::Add(&this->rewrite_);
          local_40 = google::protobuf::internal::ParseContext::ParseMessage<bloaty::Regex>
                               (ctx,msg,local_40);
          if (local_40 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == '\x1a'));
        goto LAB_00185603;
      }
LAB_001856e2:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      local_40 = google::protobuf::internal::UnknownFieldParse
                           (local_34,&this->_internal_metadata_,local_40,ctx);
    }
    else {
      if (uVar2 == 2) {
        if (cVar3 != '\x12') goto LAB_001856e2;
        s = _internal_mutable_base_data_source_abi_cxx11_(this);
        field_name = "bloaty.CustomDataSource.base_data_source";
      }
      else {
        if ((uVar2 != 1) || (cVar3 != '\n')) goto LAB_001856e2;
        s = _internal_mutable_name_abi_cxx11_(this);
        field_name = "bloaty.CustomDataSource.name";
      }
      local_40 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                           (s,local_40,ctx,field_name);
    }
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CustomDataSource::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "bloaty.CustomDataSource.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string base_data_source = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_base_data_source(), ptr, ctx, "bloaty.CustomDataSource.base_data_source");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.Regex rewrite = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_rewrite(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}